

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# App.hpp
# Opt level: O0

void __thiscall CLI::App::exit(App *this,int __status)

{
  bool bVar1;
  int iVar2;
  char *pcVar3;
  ostream *poVar4;
  ostream *in_RCX;
  ostream *in_RDX;
  undefined4 in_register_00000034;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_170;
  string local_150;
  allocator<char> local_129;
  string local_128;
  string local_108;
  string local_e8;
  allocator<char> local_c1;
  string local_c0;
  string local_a0;
  string local_80;
  string local_50;
  ostream *local_30;
  ostream *err_local;
  ostream *out_local;
  Error *e_local;
  App *this_local;
  
  out_local = (ostream *)CONCAT44(in_register_00000034,__status);
  local_30 = in_RCX;
  err_local = in_RDX;
  e_local = (Error *)this;
  Error::get_name_abi_cxx11_(&local_50,(Error *)out_local);
  bVar1 = ::std::operator==(&local_50,"RuntimeError");
  ::std::__cxx11::string::~string((string *)&local_50);
  if (bVar1) {
    Error::get_exit_code((Error *)out_local);
  }
  else {
    Error::get_name_abi_cxx11_(&local_80,(Error *)out_local);
    bVar1 = ::std::operator==(&local_80,"CallForHelp");
    ::std::__cxx11::string::~string((string *)&local_80);
    if (bVar1) {
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string<std::allocator<char>>((string *)&local_c0,"",&local_c1);
      help(&local_a0,this,&local_c0,Normal);
      ::std::operator<<(err_local,(string *)&local_a0);
      ::std::__cxx11::string::~string((string *)&local_a0);
      ::std::__cxx11::string::~string((string *)&local_c0);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_c1);
      Error::get_exit_code((Error *)out_local);
    }
    else {
      Error::get_name_abi_cxx11_(&local_e8,(Error *)out_local);
      bVar1 = ::std::operator==(&local_e8,"CallForAllHelp");
      ::std::__cxx11::string::~string((string *)&local_e8);
      if (bVar1) {
        ::std::allocator<char>::allocator();
        ::std::__cxx11::string::string<std::allocator<char>>((string *)&local_128,"",&local_129);
        help(&local_108,this,&local_128,All);
        ::std::operator<<(err_local,(string *)&local_108);
        ::std::__cxx11::string::~string((string *)&local_108);
        ::std::__cxx11::string::~string((string *)&local_128);
        ::std::allocator<char>::~allocator((allocator<char> *)&local_129);
        Error::get_exit_code((Error *)out_local);
      }
      else {
        Error::get_name_abi_cxx11_(&local_150,(Error *)out_local);
        bVar1 = ::std::operator==(&local_150,"CallForVersion");
        ::std::__cxx11::string::~string((string *)&local_150);
        if (bVar1) {
          pcVar3 = (char *)(**(code **)(*(long *)out_local + 0x10))();
          poVar4 = ::std::operator<<(err_local,pcVar3);
          ::std::ostream::operator<<(poVar4,::std::endl<char,std::char_traits<char>>);
          Error::get_exit_code((Error *)out_local);
        }
        else {
          iVar2 = Error::get_exit_code((Error *)out_local);
          if ((iVar2 != 0) &&
             (bVar1 = ::std::function::operator_cast_to_bool((function *)&this->failure_message_),
             bVar1)) {
            std::
            function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_CLI::App_*,_const_CLI::Error_&)>
            ::operator()(&local_170,&this->failure_message_,this,(Error *)out_local);
            poVar4 = ::std::operator<<(local_30,(string *)&local_170);
            ::std::ostream::operator<<(poVar4,::std::flush<char,std::char_traits<char>>);
            ::std::__cxx11::string::~string((string *)&local_170);
          }
          Error::get_exit_code((Error *)out_local);
        }
      }
    }
  }
  return;
}

Assistant:

int exit(const Error &e, std::ostream &out = std::cout, std::ostream &err = std::cerr) const {

        /// Avoid printing anything if this is a CLI::RuntimeError
        if(e.get_name() == "RuntimeError")
            return e.get_exit_code();

        if(e.get_name() == "CallForHelp") {
            out << help();
            return e.get_exit_code();
        }

        if(e.get_name() == "CallForAllHelp") {
            out << help("", AppFormatMode::All);
            return e.get_exit_code();
        }

        if(e.get_name() == "CallForVersion") {
            out << e.what() << std::endl;
            return e.get_exit_code();
        }

        if(e.get_exit_code() != static_cast<int>(ExitCodes::Success)) {
            if(failure_message_)
                err << failure_message_(this, e) << std::flush;
        }

        return e.get_exit_code();
    }